

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void formatGraphicsItemHelper(QDebug *debug,QGraphicsItem *item)

{
  long lVar1;
  Int IVar2;
  QGraphicsItem *this;
  QDebug *o;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QDebug *debug_00;
  QPointF QVar3;
  qreal z;
  QGraphicsItem *parent;
  void *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QDebug *in_stack_ffffffffffffffb0;
  QDebug local_30;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> in_stack_ffffffffffffffdc;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_1c;
  char *in_stack_ffffffffffffffe8;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGraphicsItem::parentItem((QGraphicsItem *)0x99075b);
  if (this != (QGraphicsItem *)0x0) {
    QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffe8);
    QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff98);
  }
  QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffe8);
  QVar3 = QGraphicsItem::pos((QGraphicsItem *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  t = (char *)QVar3.xp;
  QtDebugUtils::formatQPoint<QPointF>
            (in_stack_ffffffffffffffb0,
             (QPointF *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  debug_00 = (QDebug *)QGraphicsItem::zValue((QGraphicsItem *)0x9907c6);
  if (((double)debug_00 != 0.0) || (NAN((double)debug_00))) {
    QDebug::operator<<((QDebug *)this,t);
    QDebug::operator<<((QDebug *)in_RDI,(double)in_stack_ffffffffffffff98);
  }
  local_1c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
       (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)QGraphicsItem::flags(in_RDI);
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  if (IVar2 != 0) {
    o = QDebug::operator<<((QDebug *)this,t);
    QDebug::QDebug(&local_30,o);
    QGraphicsItem::flags(in_RDI);
    operator<<(debug_00,(GraphicsItemFlags)in_stack_ffffffffffffffdc.i);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QDebug::~QDebug(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void formatGraphicsItemHelper(QDebug debug, const QGraphicsItem *item)
{
    if (const QGraphicsItem *parent = item->parentItem())
          debug << ", parent=" << static_cast<const void *>(parent);
    debug << ", pos=";
    QtDebugUtils::formatQPoint(debug, item->pos());
    if (const qreal z = item->zValue())
        debug << ", z=" << z;
    if (item->flags())
        debug <<  ", flags=" << item->flags();
}